

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepTiledInputFile.cpp
# Opt level: O1

void __thiscall
Imf_3_2::DeepTiledInputFile::rawTileData
          (DeepTiledInputFile *this,int *dx,int *dy,int *lx,int *ly,char *pixelData,
          uint64_t *pixelDataSize)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint64_t uVar4;
  pthread_mutex_t *__mutex;
  IStream *pIVar5;
  ulong uVar6;
  InputStreamMutex *pIVar7;
  int iVar8;
  bool bVar9;
  int iVar10;
  uint64_t *puVar11;
  undefined4 extraout_var;
  InputExc *pIVar12;
  ostream *poVar13;
  ArgExc *pAVar14;
  ulong uVar15;
  uint64_t packedDataSize;
  uint64_t sampleCountTableSize;
  int local_1e8;
  undefined4 uStack_1e4;
  int *local_1e0;
  int *local_1d8;
  int *local_1d0;
  int *local_1c8;
  pthread_mutex_t *local_1c0;
  undefined8 local_1b8;
  ostream local_1a8 [376];
  
  iVar10 = *dx;
  iVar1 = *dy;
  iVar2 = *lx;
  iVar3 = *ly;
  local_1e0 = ly;
  local_1d8 = lx;
  local_1d0 = dy;
  local_1c8 = dx;
  bVar9 = isValidTile(this,iVar10,iVar1,iVar2,iVar3);
  if (!bVar9) {
    pAVar14 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_2::ArgExc::ArgExc(pAVar14,"Tried to read a tile outside the image file\'s data window.");
    __cxa_throw(pAVar14,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
  }
  puVar11 = TileOffsets::operator()(&this->_data->tileOffsets,iVar10,iVar1,iVar2,iVar3);
  uVar4 = *puVar11;
  if (uVar4 != 0) {
    __mutex = (pthread_mutex_t *)this->_data->_streamData;
    iVar10 = pthread_mutex_lock(__mutex);
    if (iVar10 != 0) {
      std::__throw_system_error(iVar10);
    }
    local_1c0 = __mutex;
    iVar10 = (*this->_data->_streamData->is->_vptr_IStream[5])();
    if (CONCAT44(extraout_var,iVar10) != uVar4) {
      pIVar5 = this->_data->_streamData->is;
      (*pIVar5->_vptr_IStream[6])(pIVar5,uVar4);
    }
    if ((this->_data->version & 0x1000) != 0) {
      pIVar5 = this->_data->_streamData->is;
      (*pIVar5->_vptr_IStream[3])(pIVar5,&local_1b8,4);
      if ((int)local_1b8 != this->_data->partNumber) {
        iex_debugTrap();
        std::__cxx11::stringstream::stringstream((stringstream *)&local_1b8);
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Unexpected part number ",0x17)
        ;
        poVar13 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,(int)local_1b8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar13,", should be ",0xc);
        poVar13 = (ostream *)std::ostream::operator<<((ostream *)poVar13,this->_data->partNumber);
        std::__ostream_insert<char,std::char_traits<char>>(poVar13,".",1);
        pAVar14 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_3_2::ArgExc::ArgExc(pAVar14,(stringstream *)&local_1b8);
        __cxa_throw(pAVar14,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
      }
    }
    pIVar5 = this->_data->_streamData->is;
    (*pIVar5->_vptr_IStream[3])(pIVar5,&local_1b8,4);
    iVar1 = (int)local_1b8;
    pIVar5 = this->_data->_streamData->is;
    (*pIVar5->_vptr_IStream[3])(pIVar5,&local_1b8,4);
    iVar2 = (int)local_1b8;
    pIVar5 = this->_data->_streamData->is;
    (*pIVar5->_vptr_IStream[3])(pIVar5,&local_1b8,4);
    iVar3 = (int)local_1b8;
    pIVar5 = this->_data->_streamData->is;
    (*pIVar5->_vptr_IStream[3])(pIVar5,&local_1b8,4);
    iVar8 = (int)local_1b8;
    Xdr::read<Imf_3_2::StreamIO,Imf_3_2::IStream>(this->_data->_streamData->is,&local_1b8);
    Xdr::read<Imf_3_2::StreamIO,Imf_3_2::IStream>
              (this->_data->_streamData->is,(uint64_t *)&local_1e8);
    iVar10 = *local_1c8;
    if (iVar1 == iVar10) {
      if (iVar2 == *local_1d0) {
        if (iVar3 == *local_1d8) {
          if (iVar8 == *local_1e0) {
            uVar15 = CONCAT44(local_1b8._4_4_,(int)local_1b8) + CONCAT44(uStack_1e4,local_1e8) +
                     0x28;
            uVar6 = *pixelDataSize;
            *pixelDataSize = uVar15;
            if ((pixelData == (char *)0x0) || (uVar6 < uVar15)) {
              if ((this->_data->version & 0x1000) == 0) {
                pIVar7 = this->_data->_streamData;
                pIVar5 = pIVar7->is;
                (*pIVar5->_vptr_IStream[6])(pIVar5,pIVar7->currentPosition);
              }
            }
            else {
              *(int *)pixelData = iVar10;
              *(int *)(pixelData + 4) = *local_1d0;
              *(int *)(pixelData + 8) = iVar3;
              *(int *)(pixelData + 0xc) = iVar8;
              *(long *)(pixelData + 0x10) = CONCAT44(local_1b8._4_4_,(int)local_1b8);
              *(long *)(pixelData + 0x18) = CONCAT44(uStack_1e4,local_1e8);
              Xdr::read<Imf_3_2::StreamIO,Imf_3_2::IStream>
                        (this->_data->_streamData->is,(uint64_t *)(pixelData + 0x20));
              pIVar5 = this->_data->_streamData->is;
              (*pIVar5->_vptr_IStream[3])
                        (pIVar5,pixelData + 0x28,(ulong)(uint)(local_1e8 + (int)local_1b8));
              if ((this->_data->version & 0x1000) == 0) {
                pIVar7 = this->_data->_streamData;
                pIVar7->currentPosition =
                     CONCAT44(local_1b8._4_4_,(int)local_1b8) + CONCAT44(uStack_1e4,local_1e8) +
                     pIVar7->currentPosition + 0x28;
              }
            }
            pthread_mutex_unlock(local_1c0);
            return;
          }
          pIVar12 = (InputExc *)__cxa_allocate_exception(0x48);
          Iex_3_2::InputExc::InputExc(pIVar12,"Unexpected tile y level number coordinate.");
        }
        else {
          pIVar12 = (InputExc *)__cxa_allocate_exception(0x48);
          Iex_3_2::InputExc::InputExc(pIVar12,"Unexpected tile x level number coordinate.");
        }
      }
      else {
        pIVar12 = (InputExc *)__cxa_allocate_exception(0x48);
        Iex_3_2::InputExc::InputExc(pIVar12,"Unexpected tile y coordinate.");
      }
    }
    else {
      pIVar12 = (InputExc *)__cxa_allocate_exception(0x48);
      Iex_3_2::InputExc::InputExc(pIVar12,"Unexpected tile x coordinate.");
    }
    __cxa_throw(pIVar12,&Iex_3_2::InputExc::typeinfo,Iex_3_2::InputExc::~InputExc);
  }
  iex_debugTrap();
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Tile (",6);
  poVar13 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,*local_1c8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar13,", ",2);
  poVar13 = (ostream *)std::ostream::operator<<((ostream *)poVar13,*local_1d0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar13,", ",2);
  poVar13 = (ostream *)std::ostream::operator<<((ostream *)poVar13,*local_1d8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar13,", ",2);
  poVar13 = (ostream *)std::ostream::operator<<((ostream *)poVar13,*local_1e0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar13,") is missing.",0xd);
  pIVar12 = (InputExc *)__cxa_allocate_exception(0x48);
  Iex_3_2::InputExc::InputExc(pIVar12,(stringstream *)&local_1b8);
  __cxa_throw(pIVar12,&Iex_3_2::InputExc::typeinfo,Iex_3_2::InputExc::~InputExc);
}

Assistant:

void
DeepTiledInputFile::rawTileData (
    int&      dx,
    int&      dy,
    int&      lx,
    int&      ly,
    char*     pixelData,
    uint64_t& pixelDataSize) const
{
    if (!isValidTile (dx, dy, lx, ly))
        throw IEX_NAMESPACE::ArgExc ("Tried to read a tile outside "
                                     "the image file's data window.");

    uint64_t tileOffset = _data->tileOffsets (dx, dy, lx, ly);

    if (tileOffset == 0)
    {
        THROW (
            IEX_NAMESPACE::InputExc,
            "Tile (" << dx << ", " << dy << ", " << lx << ", " << ly
                     << ") is missing.");
    }

#if ILMTHREAD_THREADING_ENABLED
    std::lock_guard<std::mutex> lock (*_data->_streamData);
#endif
    if (_data->_streamData->is->tellg () != tileOffset)
        _data->_streamData->is->seekg (tileOffset);

    //
    // Read the first few bytes of the tile (the header).
    // Verify that the tile coordinates and the level number
    // are correct.
    //

    int tileXCoord, tileYCoord, levelX, levelY;

    if (isMultiPart (_data->version))
    {
        int partNumber;
        Xdr::read<StreamIO> (*_data->_streamData->is, partNumber);
        if (partNumber != _data->partNumber)
        {
            THROW (
                IEX_NAMESPACE::ArgExc,
                "Unexpected part number " << partNumber << ", should be "
                                          << _data->partNumber << ".");
        }
    }

    Xdr::read<StreamIO> (*_data->_streamData->is, tileXCoord);
    Xdr::read<StreamIO> (*_data->_streamData->is, tileYCoord);
    Xdr::read<StreamIO> (*_data->_streamData->is, levelX);
    Xdr::read<StreamIO> (*_data->_streamData->is, levelY);

    uint64_t sampleCountTableSize;
    uint64_t packedDataSize;
    Xdr::read<StreamIO> (*_data->_streamData->is, sampleCountTableSize);

    Xdr::read<StreamIO> (*_data->_streamData->is, packedDataSize);

    if (tileXCoord != dx)
        throw IEX_NAMESPACE::InputExc ("Unexpected tile x coordinate.");

    if (tileYCoord != dy)
        throw IEX_NAMESPACE::InputExc ("Unexpected tile y coordinate.");

    if (levelX != lx)
        throw IEX_NAMESPACE::InputExc (
            "Unexpected tile x level number coordinate.");

    if (levelY != ly)
        throw IEX_NAMESPACE::InputExc (
            "Unexpected tile y level number coordinate.");

    // total requirement for reading all the data

    uint64_t totalSizeRequired = 40 + sampleCountTableSize + packedDataSize;

    bool big_enough = totalSizeRequired <= pixelDataSize;

    pixelDataSize = totalSizeRequired;

    // was the block we were given big enough?
    if (!big_enough || pixelData == NULL)
    {
        // special case: seek stream back to start if we are at the beginning (regular reading pixels assumes it doesn't need to seek
        // in single part files)
        if (!isMultiPart (_data->version))
        {
            _data->_streamData->is->seekg (_data->_streamData->currentPosition);
        }
        // leave lock here - bail before reading more data
        return;
    }

    // copy the values we have read into the output block
    *(int*) (pixelData + 0)       = dx;
    *(int*) (pixelData + 4)       = dy;
    *(int*) (pixelData + 8)       = levelX;
    *(int*) (pixelData + 12)      = levelY;
    *(uint64_t*) (pixelData + 16) = sampleCountTableSize;
    *(uint64_t*) (pixelData + 24) = packedDataSize;

    // didn't read the unpackedsize - do that now
    Xdr::read<StreamIO> (
        *_data->_streamData->is, *(uint64_t*) (pixelData + 32));

    // read the actual data
    _data->_streamData->is->read (
        pixelData + 40,
        static_cast<int> (sampleCountTableSize + packedDataSize));

    if (!isMultiPart (_data->version))
    {
        _data->_streamData->currentPosition +=
            sampleCountTableSize + packedDataSize + 40;
    }

    // leave lock here
}